

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O1

QVariant * __thiscall
AbstractStringSerialiserPrivate::stringToVariant
          (QVariant *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,QString *val)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  QByteArray data;
  QDataStream inStream;
  QByteArray local_50;
  QString local_38;
  Version local_20;
  
  QString::toLatin1_helper(&local_38);
  QByteArray::fromBase64(&local_50,&local_38,0);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,8);
    }
  }
  pcVar4 = (char16_t *)local_50.d.ptr;
  if ((char16_t *)local_50.d.ptr == (char16_t *)0x0) {
    pcVar4 = (char16_t *)&QByteArray::_empty;
  }
  qUncompress((uchar *)&local_38,(longlong)pcVar4);
  qVar3 = local_50.d.size;
  pcVar2 = local_50.d.ptr;
  pDVar1 = local_50.d.d;
  local_50.d.d = (Data *)local_38.d.d;
  local_38.d.d = (Data *)pDVar1;
  local_50.d.ptr = (char *)local_38.d.ptr;
  local_50.d.size = local_38.d.size;
  local_38.d.ptr = (char16_t *)pcVar2;
  local_38.d.size = qVar3;
  if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar1->super_QArrayData,1,8);
    }
  }
  QDataStream::QDataStream((QDataStream *)&local_38,&local_50);
  local_20 = (this->super_AbstractModelSerialiserPrivate).m_streamVersion;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  ::operator>>((QDataStream *)&local_38,__return_storage_ptr__);
  QDataStream::~QDataStream((QDataStream *)&local_38);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant AbstractStringSerialiserPrivate::stringToVariant(const QString &val) const
{
    QByteArray data = QByteArray::fromBase64(val.toLatin1());
    data = qUncompress(data);
    QDataStream inStream(data);
    inStream.setVersion(m_streamVersion);
    QVariant result;
    inStream >> result;
    return result;
}